

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigVec.c
# Opt level: O2

void Fraig_NodeVecPushOrder(Fraig_NodeVec_t *p,Fraig_Node_t *pNode)

{
  Fraig_Node_t **ppFVar1;
  Fraig_Node_t *pFVar2;
  ulong uVar3;
  
  Fraig_NodeVecPush(p,pNode);
  uVar3 = (ulong)(uint)p->nSize;
  while( true ) {
    if ((int)uVar3 < 2) {
      return;
    }
    ppFVar1 = p->pArray;
    pFVar2 = ppFVar1[uVar3 - 1];
    if (ppFVar1[uVar3 - 2] <= pFVar2) break;
    ppFVar1[uVar3 - 1] = ppFVar1[uVar3 - 2];
    p->pArray[uVar3 - 2] = pFVar2;
    uVar3 = uVar3 - 1;
  }
  return;
}

Assistant:

void Fraig_NodeVecPushOrder( Fraig_NodeVec_t * p, Fraig_Node_t * pNode )
{
    Fraig_Node_t * pNode1, * pNode2;
    int i;
    Fraig_NodeVecPush( p, pNode );
    // find the p of the node
    for ( i = p->nSize-1; i > 0; i-- )
    {
        pNode1 = p->pArray[i  ];
        pNode2 = p->pArray[i-1];
        if ( pNode1 >= pNode2 )
            break;
        p->pArray[i  ] = pNode2;
        p->pArray[i-1] = pNode1;
    }
}